

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O1

Node * __thiscall ScapeGoatTree::findMax(ScapeGoatTree *this,Node *node)

{
  Node *pNVar1;
  
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar1 = node;
    node = node->rightChild;
  } while (node != (Node *)0x0);
  return pNVar1;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::findMax(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->rightChild == nullptr) {
        return node;
    } else {
        return findMax(node->rightChild);
    }
}